

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatienceSort.h
# Opt level: O3

void __thiscall
PatienceSorting<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>::
GenerateRuns(PatienceSorting<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
             *this,__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
            __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
            vector<RunPool<int>_*,_std::allocator<RunPool<int>_*>_> *runs)

{
  int *piVar1;
  size_t sVar2;
  pointer piVar3;
  pointer piVar4;
  iterator __position;
  iterator iVar5;
  bool bVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  RunBlock<int> **ppRVar12;
  pointer piVar13;
  RunPool<int> *pRVar14;
  RunBlock<int> *pRVar15;
  int *piVar16;
  RunBlock<int> *pRVar17;
  pointer piVar18;
  ulong uVar19;
  pointer ppRVar20;
  int iVar21;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var22;
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  float fVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  vector<int,std::allocator<int>> *pvVar30;
  ValueType value;
  RunPool<int> *run;
  int local_54;
  RunPool<int> *local_50;
  vector<int,std::allocator<int>> *local_48;
  double dStack_40;
  
  ppRVar20 = (runs->super__Vector_base<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  if ((runs->super__Vector_base<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppRVar20) {
    (runs->super__Vector_base<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = ppRVar20;
  }
  uVar25 = (long)end._M_current - (long)begin._M_current >> 2;
  dVar27 = (double)(long)uVar25;
  this->num_elements_ = uVar25;
  if (dVar27 < 0.0) {
    dVar27 = sqrt(dVar27);
  }
  else {
    dVar27 = SQRT(dVar27);
  }
  uVar19 = (long)(dVar27 - 9.223372036854776e+18) & (long)dVar27 >> 0x3f | (long)dVar27;
  this->num_runs_ = uVar19;
  if (end._M_current + -1 == begin._M_current) {
    iVar21 = 0;
  }
  else {
    iVar21 = 0;
    _Var22._M_current = begin._M_current;
    iVar23 = *begin._M_current;
    do {
      piVar1 = _Var22._M_current + 1;
      _Var22._M_current = _Var22._M_current + 1;
      iVar21 = iVar21 + (uint)(*piVar1 < iVar23);
      iVar23 = *piVar1;
    } while (_Var22._M_current != end._M_current + -1);
  }
  this->values_not_in_order_ = iVar21;
  fVar26 = (float)iVar21 / (float)this->num_elements_;
  this->sortedness_ = fVar26;
  if (fVar26 <= 0.35) {
    fVar26 = (float)uVar19 * 1.5;
    uVar25 = (ulong)fVar26;
    run_blocks_ = (long)(fVar26 - 9.223372e+18) & (long)uVar25 >> 0x3f | uVar25;
    Init();
    uVar25 = this->num_elements_;
    sVar2 = this->num_runs_;
    uVar19 = uVar25;
    uVar24 = uVar25;
    if (99 < uVar25) {
      do {
        uVar19 = uVar24 / 100;
        bVar6 = 9999 < uVar24;
        uVar24 = uVar19;
      } while (bVar6);
    }
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar19;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar25;
    auVar29._8_4_ = (int)(sVar2 >> 0x20);
    auVar29._0_8_ = sVar2;
    auVar29._12_4_ = 0x45300000;
    dVar27 = auVar29._8_8_ - 1.9342813113834067e+25;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = SUB168(auVar10 / auVar8,0);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar25;
    uVar25 = SUB168(auVar11 / auVar9,0);
    if ((long)uVar25 < 0) {
      fVar26 = (float)((ulong)(SUB164(auVar11 / auVar9,0) & 1) | uVar25 >> 1);
      fVar26 = fVar26 + fVar26;
    }
    else {
      fVar26 = (float)(long)uVar25;
    }
    pvVar30 = (vector<int,std::allocator<int>> *)
              (dVar27 + ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0));
    dVar28 = (double)(fVar26 * 15.0);
    if (dVar28 < 0.0) {
      local_48 = pvVar30;
      dStack_40 = dVar27;
      dVar28 = sqrt(dVar28);
      pvVar30 = local_48;
    }
    else {
      dVar28 = SQRT(dVar28);
    }
    uVar25 = (ulong)(dVar28 * (double)pvVar30);
    RunPool<int>::mem_blocks_ =
         (long)(dVar28 * (double)pvVar30 - 9.223372036854776e+18) & (long)uVar25 >> 0x3f | uVar25;
    RunPool<int>::Init();
    std::vector<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>::reserve(runs,this->num_runs_);
    std::vector<int,_std::allocator<int>_>::reserve(&this->lasts_,this->num_elements_);
    local_48 = (vector<int,std::allocator<int>> *)&this->heads_;
    std::vector<int,_std::allocator<int>_>::reserve
              ((vector<int,_std::allocator<int>_> *)local_48,this->num_elements_);
    for (; pRVar15 = RunPool<int>::next_free_, pRVar14 = next_free_,
        begin._M_current != end._M_current; begin._M_current = begin._M_current + 1) {
      local_54 = *begin._M_current;
      piVar3 = (this->lasts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar4 = (this->lasts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      piVar18 = piVar3;
      uVar25 = (long)piVar4 - (long)piVar3 >> 2;
      while (piVar13 = piVar18, 0 < (long)uVar25) {
        uVar19 = uVar25 >> 1;
        uVar25 = ~uVar19 + uVar25;
        piVar18 = piVar13 + uVar19 + 1;
        if ((piVar13 + uVar19 + 1)[-1] <= local_54) {
          piVar18 = piVar13;
          uVar25 = uVar19;
        }
      }
      if (piVar13 == piVar4) {
        piVar3 = (this->heads_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar4 = (this->heads_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        piVar18 = piVar3;
        uVar25 = (long)piVar4 - (long)piVar3 >> 2;
        while (piVar13 = piVar18, 0 < (long)uVar25) {
          uVar19 = uVar25 >> 1;
          uVar25 = ~uVar19 + uVar25;
          piVar18 = piVar13 + uVar19 + 1;
          if (local_54 <= (piVar13 + uVar19 + 1)[-1]) {
            piVar18 = piVar13;
            uVar25 = uVar19;
          }
        }
        if (piVar13 == piVar4) {
          local_50 = next_free_;
          ppRVar12 = &next_free_->begin_back_;
          next_free_ = next_free_ + 1;
          pRVar17 = RunPool<int>::next_free_ + 1;
          *ppRVar12 = RunPool<int>::next_free_;
          RunPool<int>::next_free_ = pRVar17;
          pRVar14->end_back_ = pRVar15;
          pRVar14->size_ = 0;
          pRVar14->begin_front_ = (RunBlock<int> *)0x0;
          pRVar14->end_front_ = (RunBlock<int> *)0x0;
          pRVar14->end_block_ = pRVar15;
          __position._M_current =
               (runs->super__Vector_base<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (runs->super__Vector_base<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<RunPool<int>*,std::allocator<RunPool<int>*>>::
            _M_realloc_insert<RunPool<int>*const&>
                      ((vector<RunPool<int>*,std::allocator<RunPool<int>*>> *)runs,__position,
                       &local_50);
            ppRVar20 = (runs->super__Vector_base<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            *__position._M_current = pRVar14;
            ppRVar20 = (runs->super__Vector_base<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>).
                       _M_impl.super__Vector_impl_data._M_finish + 1;
            (runs->super__Vector_base<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>)._M_impl.
            super__Vector_impl_data._M_finish = ppRVar20;
          }
          RunPool<int>::Add(ppRVar20[-1],&local_54);
          iVar5._M_current =
               (this->lasts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->lasts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)this,iVar5,&local_54);
          }
          else {
            *iVar5._M_current = local_54;
            (this->lasts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          iVar5._M_current =
               (this->heads_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->heads_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_48,iVar5,&local_54);
          }
          else {
            *iVar5._M_current = local_54;
            (this->heads_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
        }
        else {
          RunPool<int>::AddFront
                    (*(RunPool<int> **)
                      ((long)(runs->
                             super__Vector_base<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>).
                             _M_impl.super__Vector_impl_data._M_start +
                      ((long)piVar13 - (long)piVar3) * 2),&local_54);
          *(int *)(*(long *)local_48 + ((long)piVar13 - (long)piVar3)) = local_54;
        }
      }
      else {
        RunPool<int>::Add(*(RunPool<int> **)
                           ((long)(runs->
                                  super__Vector_base<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>
                                  )._M_impl.super__Vector_impl_data._M_start +
                           ((long)piVar13 - (long)piVar3) * 2),&local_54);
        *(int *)((long)(this->lasts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + ((long)piVar13 - (long)piVar3)) = local_54
        ;
        if ((((long)piVar13 - (long)piVar3 == 0) &&
            (piVar1 = begin._M_current + 1, piVar1 != end._M_current)) &&
           (piVar16 = piVar1,
           *(this->lasts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start < *piVar1)) {
          do {
            begin._M_current = piVar16;
            RunPool<int>::Add(*(runs->
                               super__Vector_base<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>).
                               _M_impl.super__Vector_impl_data._M_start,begin._M_current);
            iVar21 = *begin._M_current;
            *(this->lasts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start = iVar21;
            piVar16 = begin._M_current + 1;
          } while (iVar21 < *piVar1);
        }
      }
    }
  }
  else if (begin._M_current != end._M_current) {
    lVar7 = 0x3f;
    if (uVar25 != 0) {
      for (; uVar25 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (begin._M_current,end._M_current,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (begin._M_current,end._M_current);
    return;
  }
  return;
}

Assistant:

void GenerateRuns(RAI begin, RAI end, std::vector<RunPool<ValueType>*>& runs) {
        runs.clear();
        num_elements_ = std::distance(begin, end);
        num_runs_ = static_cast<size_t>(sqrt(num_elements_));

        // calculate the degree of disorder
        values_not_in_order_ = GetOrderLevel(begin, end);
        sortedness_ = values_not_in_order_ / static_cast<float>(num_elements_);

        // fallback to std::sort if input data is too random
        if(sortedness_ > kMaxSortedness) {
            std::sort(begin, end);
            return;
        }

        // Pool for runs
        SetMemSize(num_runs_ * kRunPoolSize);
        Init();

        // Pool for runblocks
        RunPool<ValueType>::SetMemSize(GetMemPoolSize(num_elements_, num_runs_));
        RunPool<ValueType>::Init();


        runs.reserve(num_runs_);
        lasts_.reserve(num_elements_);
        heads_.reserve(num_elements_);

        for (auto it = begin; it != end; ++it) {

            // binary search the right run to insert the current element
            ValueType value = *it;
            auto key = std::lower_bound(lasts_.begin(), lasts_.end(), value, [](ValueType& v1, ValueType v2) { return v1 > v2;});

            if (key != lasts_.end()) {      // if suitable run is found, append
                size_t i = std::distance(lasts_.begin(), key);
                runs[i]->Add(value);
                lasts_[i] = value;

                // if we add to the first run, try to add as many elements as possible to avoid expensive binary search
                if (i == 0) {
                    auto next_value = std::next(it, 1);
                    while (next_value != end
                           && *next_value > lasts_[i]) {
                        it++;
                        runs[0]->Add(*it);
                        lasts_[0] = *it;
                    }
                }
            }
            else {      // no suitable run found, so we try to add the element to the begin of a run

                // binary search the beginnings to find a suitable run
                key = std::lower_bound(heads_.begin(), heads_.end(), value);
                if (key == heads_.end()) {      // no suitable run found, create a new run and add it to sorted runs vector

                    RunPool<ValueType>* run = Alloc();
                    new(run) RunPool<ValueType>();      // necessary, otherwise the objects are not initialized -> memory error
                    runs.push_back(run);

                    runs.back()->Add(value);
                    lasts_.push_back(value);
                    heads_.push_back(value);
                } else {
                    // suitable run found, so append to its beginning.
                    size_t i = std::distance(heads_.begin(), key);
                    runs[i]->AddFront(value);
                    heads_[i] = value;
                }
            }
        }
    }